

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O3

void __thiscall iqxmlrpc::Binary_data::Binary_data(Binary_data *this,string *s,bool raw)

{
  undefined3 in_register_00000011;
  
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Binary_data_0018b038;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->base64)._M_dataplus._M_p = (pointer)&(this->base64).field_2;
  (this->base64)._M_string_length = 0;
  (this->base64).field_2._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000011,raw) == 0) {
    std::__cxx11::string::_M_assign((string *)&this->base64);
    decode(this);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->data);
  }
  return;
}

Assistant:

Binary_data::Binary_data( const std::string& s, bool raw )
{
  if( raw )
    data = s;
  else
  {
    base64 = s;
    decode();
  }
}